

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmemcontext.h
# Opt level: O1

void __thiscall
cookmem::SimpleMemContext<cookmem::MmapArena,cookmem::NoActionMemLogger,void>::~SimpleMemContext
          (SimpleMemContext<cookmem::MmapArena,cookmem::NoActionMemLogger,void> *this)

{
  SimpleMemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::~SimpleMemContext
            ((SimpleMemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *)
             (this + -0x20));
  return;
}

Assistant:

virtual ~MemContext()
    {
    }